

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<DataStream,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *v)

{
  long lVar1;
  bool bVar2;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  DataStream *in_stack_ffffffffffffffa8;
  DataStream *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)in_stack_ffffffffffffffa8);
  WriteCompactSize<DataStream>(in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::begin(in_RSI);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ((__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         (DataStream *)
         __gnu_cxx::
         __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::operator*((__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_ffffffffffffffa8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x702e23);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }